

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphUtils.hpp
# Opt level: O0

pair<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
* __thiscall
floorplan::GraphUtils::makesimpleGraph_abi_cxx11_
          (pair<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
           *__return_storage_ptr__,GraphUtils *this,floorplanGraph *G)

{
  vertex_descriptor v_00;
  mapped_type_conflict mVar1;
  bool bVar2;
  type tVar3;
  reference ppvVar4;
  void *v_01;
  void *v_02;
  vertex_bundled *pvVar5;
  mapped_type_conflict *pmVar6;
  vertices_size_type vVar7;
  vertices_size_type vVar8;
  edges_size_type eVar9;
  edges_size_type eVar10;
  vec_adj_list_impl<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  pair<std::_List_iterator<void_*>,_std::_List_iterator<void_*>_> pVar11;
  pair<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>_>
  pVar12;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_198;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_178;
  vertex_descriptor local_158;
  simpleVertex simpleTarget;
  simpleVertex simpleSource;
  string targetID;
  string sourceID;
  Vertex targetVertex;
  Vertex sourceVertex;
  void *local_f0;
  void *local_e8;
  undefined1 local_e0 [8];
  edge_descriptor e;
  pair<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>_>
  bgl_range_122;
  simpleVertex currentVertex;
  vertex_descriptor v;
  _List_iterator<void_*> local_98;
  pair<std::_List_iterator<void_*>,_std::_List_iterator<void_*>_> bgl_range_118;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  fpGraphToSimpleGraph;
  undefined1 local_50 [8];
  simpleGraph ret;
  floorplanGraph *G_local;
  
  ret.m_property.px = (no_property *)this;
  boost::
  adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>
  ::adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>
                    *)local_50,
                   (no_property *)
                   ((long)&fpGraphToSimpleGraph._M_t._M_impl.super__Rb_tree_header._M_node_count + 7
                   ));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)&bgl_range_118.second);
  pVar11 = boost::
           vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config>>
                     ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config>_>
                       *)ret.m_property.px);
  while( true ) {
    bgl_range_118.first = pVar11.second._M_node;
    local_98 = pVar11.first._M_node;
    bVar2 = std::operator!=(&local_98,&bgl_range_118.first);
    if (!bVar2) break;
    while (bVar2 = std::operator!=(&local_98,&bgl_range_118.first), bVar2) {
      ppvVar4 = std::_List_iterator<void_*>::operator*(&local_98);
      v_00 = *ppvVar4;
      bgl_range_122.second.
      super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
      .m_iterator._M_node =
           (iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
            )boost::
             add_vertex<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>::config>>
                       ((vec_adj_list_impl<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config>_>
                         *)local_50);
      mVar1 = (mapped_type_conflict)
              bgl_range_122.second.
              super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
              .m_iterator._M_node;
      pvVar5 = boost::
               adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
               ::operator[]((adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                             *)ret.m_property.px,v_00);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&bgl_range_118.second,&pvVar5->vertex_id);
      *pmVar6 = mVar1;
      std::_List_iterator<void_*>::operator++(&local_98);
    }
    pVar11.second._M_node = bgl_range_118.first._M_node;
    pVar11.first._M_node = bgl_range_118.first._M_node;
  }
  pVar12 = boost::
           edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config>
                     ((undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config>
                       *)ret.m_property.px);
  while( true ) {
    bgl_range_122.first =
         pVar12.second.
         super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
         .m_iterator._M_node;
    e.m_eproperty =
         (property_type *)
         pVar12.first.
         super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
         .m_iterator._M_node;
    tVar3 = boost::iterators::operator!=
                      ((iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
                        *)&e.m_eproperty,
                       (iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
                        *)&bgl_range_122);
    if (!tVar3) break;
    boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>::edge_desc_impl
              ((edge_desc_impl<boost::undirected_tag,_void_*> *)local_e0);
    while (tVar3 = boost::iterators::operator!=
                             ((iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
                               *)&e.m_eproperty,
                              (iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
                               *)&bgl_range_122), tVar3) {
      boost::iterators::detail::
      iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
      ::operator*((reference *)&sourceVertex,
                  (iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
                   *)&e.m_eproperty);
      local_e0 = (undefined1  [8])sourceVertex;
      e.super_edge_base<boost::undirected_tag,_void_*>.m_source = local_f0;
      e.super_edge_base<boost::undirected_tag,_void_*>.m_target = local_e8;
      v_01 = boost::
             source<boost::undirected_tag,void*,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>
                       ((edge_base<boost::undirected_tag,_void_*> *)local_e0,
                        (adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                         *)ret.m_property.px);
      v_02 = boost::
             target<boost::undirected_tag,void*,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>
                       ((edge_base<boost::undirected_tag,_void_*> *)local_e0,
                        (adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                         *)ret.m_property.px);
      pvVar5 = boost::
               adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
               ::operator[]((adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                             *)ret.m_property.px,v_01);
      std::__cxx11::string::string
                ((string *)(targetID.field_2._M_local_buf + 8),(string *)&pvVar5->vertex_id);
      pvVar5 = boost::
               adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
               ::operator[]((adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                             *)ret.m_property.px,v_02);
      std::__cxx11::string::string((string *)&simpleSource,(string *)&pvVar5->vertex_id);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&bgl_range_118.second,(key_type *)((long)&targetID.field_2 + 8));
      simpleTarget = (simpleVertex)*pmVar6;
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&bgl_range_118.second,(key_type *)&simpleSource);
      local_158 = (vertex_descriptor)*pmVar6;
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>::config>>
                (&local_178,(boost *)simpleTarget,local_158,(vertex_descriptor)local_50,
                 (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config>_>
                  *)in_R8);
      if (((local_178.second ^ 0xffU) & 1) != 0) {
        boost::
        add_edge<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>::config>>
                  (&local_198,(boost *)simpleTarget,local_158,(vertex_descriptor)local_50,in_R8);
      }
      std::__cxx11::string::~string((string *)&simpleSource);
      std::__cxx11::string::~string((string *)(targetID.field_2._M_local_buf + 8));
      boost::iterators::detail::
      iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
      ::operator++((iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
                    *)&e.m_eproperty);
    }
    pVar12.second =
         (undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
          )(undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
            )bgl_range_122.first.
             super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
             .m_iterator._M_node;
    pVar12.first = (undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
                    )(undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
                      )bgl_range_122.first.
                       super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_spaceEdge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
                       .m_iterator._M_node;
  }
  vVar7 = boost::
          num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config>>
                    ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config>_>
                      *)ret.m_property.px);
  vVar8 = boost::
          num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>::config>>
                    ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config>_>
                      *)local_50);
  if (vVar7 == vVar8) {
    eVar9 = boost::
            num_edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config>
                      ((undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config>
                        *)ret.m_property.px);
    eVar10 = boost::
             num_edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>::config>
                       ((undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config>
                         *)local_50);
    if (eVar9 == eVar10) {
      std::
      make_pair<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_weight_t,int,boost::no_property>,boost::no_property,boost::listS>&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>&>
                (__return_storage_ptr__,
                 (adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>
                  *)local_50,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)&bgl_range_118.second);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&bgl_range_118.second);
      boost::
      adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>
      ::~adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>
                         *)local_50);
      return __return_storage_ptr__;
    }
    __assert_fail("boost::num_edges(G) == boost::num_edges(ret)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alperv[P]libfloorplan/src/lib/GraphUtils.hpp"
                  ,0x85,
                  "static std::pair<simpleGraph, std::map<string, int>> floorplan::GraphUtils::makesimpleGraph(const floorplanGraph &)"
                 );
  }
  __assert_fail("boost::num_vertices(G) == boost::num_vertices(ret)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/alperv[P]libfloorplan/src/lib/GraphUtils.hpp"
                ,0x84,
                "static std::pair<simpleGraph, std::map<string, int>> floorplan::GraphUtils::makesimpleGraph(const floorplanGraph &)"
               );
}

Assistant:

static std::pair<simpleGraph, std::map<string,int> > makesimpleGraph (const floorplanGraph& G){
        simpleGraph ret;
        map<string, int> fpGraphToSimpleGraph;
        BGL_FORALL_VERTICES(v, G, floorplanGraph){
            simpleVertex currentVertex = add_vertex(ret);
            fpGraphToSimpleGraph[G[v].vertex_id] = currentVertex;
        }
        BGL_FORALL_EDGES(e, G, floorplanGraph){
            Vertex sourceVertex = source(e, G);
            Vertex targetVertex = target(e,G);
            string sourceID =G[sourceVertex].vertex_id;
            string targetID = G[targetVertex].vertex_id;
            simpleVertex simpleSource = fpGraphToSimpleGraph[sourceID];
            simpleVertex simpleTarget = fpGraphToSimpleGraph[targetID];
            if (!edge(simpleSource,simpleTarget,ret).second)
                add_edge(simpleSource,simpleTarget, ret);
        }
        assert(boost::num_vertices(G) == boost::num_vertices(ret));
        assert(boost::num_edges(G) == boost::num_edges(ret));
        return make_pair(ret, fpGraphToSimpleGraph);
    }